

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::
get_match_positions_component_prefix_dirpath
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns)

{
  char *pcVar1;
  char *pcVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_first;
  iterator_type query_last;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_last_00;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var3;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_it;
  char *pcVar4;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var5;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_it;
  
  _Var3._M_current = (this->qit_basename_)._M_current;
  pcVar2 = (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (_Var3._M_current != pcVar2) {
    item_first._M_current =
         (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    _Var5._M_current = (this->item_basename_)._M_current;
    query_last_00._M_current = _Var3._M_current;
    do {
      do {
        pcVar4 = _Var5._M_current + -1;
        if ((_Var3._M_current != pcVar2) && (*pcVar4 == _Var3._M_current[-1])) {
          _Var3._M_current = _Var3._M_current + -1;
        }
        item_it._M_current = item_first._M_current;
      } while ((pcVar4 != item_first._M_current) &&
              (pcVar1 = _Var5._M_current + -2, item_it._M_current = pcVar4,
              _Var5._M_current = pcVar4, *pcVar1 != '/'));
      query_it._M_current = _Var3._M_current;
      if (_Var3._M_current != query_last_00._M_current) {
        do {
          query_it._M_current = _Var3._M_current;
          if (*item_it._M_current == *_Var3._M_current) break;
          _Var3._M_current = _Var3._M_current + 1;
          query_it._M_current = query_last_00._M_current;
        } while (_Var3._M_current != query_last_00._M_current);
      }
      Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits>::
      get_match_positions_greedy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                ((Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits> *)this,posns,item_first
                 ,item_it,query_it,query_last_00);
      _Var3._M_current = query_it._M_current;
      _Var5._M_current = item_it._M_current;
      query_last_00._M_current = query_it._M_current;
    } while (query_it._M_current != pcVar2);
  }
  return;
}

Assistant:

void get_match_positions_component_prefix_dirpath(
      std::vector<std::size_t>& posns) const {
    auto item_rit = ReverseIterator(item_basename_);
    auto const item_rlast = item_.crend();
    auto const item_first = item_.cbegin();
    auto query_rit = ReverseIterator(qit_basename_);
    auto const query_rlast = query_.crend();
    auto query_pc_last = query_rit.base();

    while (query_rit != query_rlast) {
      consume_path_component_match_front(item_rit, item_rlast, query_rit,
                                         query_rlast);
      get_match_positions_greedy(posns, item_first, item_rit.base(),
                                 query_rit.base(), query_pc_last);
      query_pc_last = query_rit.base();
    }
  }